

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerhand_test.cpp
# Opt level: O0

void __thiscall TEST_PlayerHandTest_Triplet_Test::testBody(TEST_PlayerHandTest_Triplet_Test *this)

{
  initializer_list<mahjong::Tile> __l;
  bool bVar1;
  UtestShell *pUVar2;
  PlayerHand *this_00;
  NormalTestTerminator local_60 [3];
  allocator<mahjong::Tile> local_45;
  Tile local_44 [3];
  iterator local_38;
  size_type local_30;
  vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> local_28;
  TEST_PlayerHandTest_Triplet_Test *local_10;
  TEST_PlayerHandTest_Triplet_Test *this_local;
  
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupPlayerHandTest).h;
  local_10 = this;
  mahjong::PlayerHand::add(this_00,OneOfCircles);
  mahjong::PlayerHand::add(this_00,OneOfCircles);
  mahjong::PlayerHand::add(this_00,OneOfCircles);
  local_44[0] = OneOfCircles;
  local_44[1] = 0xd2;
  local_44[2] = 0xd2;
  local_38 = local_44;
  local_30 = 3;
  std::allocator<mahjong::Tile>::allocator(&local_45);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::vector(&local_28,__l,&local_45);
  mahjong::PlayerHand::bindTriplet(this_00,&local_28);
  std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::~vector(&local_28);
  std::allocator<mahjong::Tile>::~allocator(&local_45);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = mahjong::PlayerHand::isClosedHand(&(this->super_TEST_GROUP_CppUTestGroupPlayerHandTest).h)
  ;
  local_60[0].super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
  NormalTestTerminator::NormalTestTerminator(local_60);
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!h.isClosedHand()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/playerhand_test.cpp"
             ,0x22,local_60);
  NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1c4561);
  return;
}

Assistant:

TEST(PlayerHandTest, Triplet)
{
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);

	h.bindTriplet({
		Tile::OneOfCircles,
		Tile::OneOfCircles,
		Tile::OneOfCircles
	});

	CHECK(!h.isClosedHand());
}